

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O1

PDFFormXObject * __thiscall
TIFFImageHandler::CreateFormXObjectFromTIFFStream
          (TIFFImageHandler *this,IByteReaderWithPosition *inTIFFStream,ObjectIDType inFormXObjectID
          ,TIFFUsageParameters *inTIFFUsageParameters)

{
  T2P *pTVar1;
  undefined8 uVar2;
  CMYKRGBColor CVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  uchar uVar7;
  uchar uVar8;
  int iVar9;
  undefined4 extraout_var;
  TIFF *tif;
  PDFFormXObject *pPVar10;
  Trace *pTVar11;
  StreamWithPos streamInfo;
  
  TIFFSetErrorHandler(ReportError);
  TIFFSetWarningHandler(ReportWarning);
  if ((this->mObjectsContext == (ObjectsContext *)0x0) ||
     (this->mContainerDocumentContext == (DocumentContext *)0x0)) {
    pTVar11 = Trace::DefaultTrace();
    pPVar10 = (PDFFormXObject *)0x0;
    Trace::TraceToLog(pTVar11,
                      "TIFFImageHandler::CreateFormXObjectFromTIFFFile. Unexpected Error, mObjectsContext or mContainerDocumentContext not initialized"
                     );
    tif = (TIFF *)0x0;
  }
  else {
    streamInfo.mStream = inTIFFStream;
    iVar9 = (*(inTIFFStream->super_IByteReader)._vptr_IByteReader[6])(inTIFFStream);
    streamInfo.mOriginalPosition = CONCAT44(extraout_var,iVar9);
    tif = TIFFClientOpen("Stream","r",&streamInfo,STATIC_streamRead,STATIC_streamWrite,
                         STATIC_streamSeek,STATIC_streamClose,STATIC_tiffSize,STATIC_tiffMap,
                         STATIC_tiffUnmap);
    if (tif == (TIFF *)0x0) {
      pTVar11 = Trace::DefaultTrace();
      pPVar10 = (PDFFormXObject *)0x0;
      Trace::TraceToLog(pTVar11,
                        "TIFFImageHandler::CreateFormXObjectFromTIFFFile. cannot open stream for reading"
                       );
    }
    else {
      InitializeConversionState(this);
      pTVar1 = this->mT2p;
      pTVar1->input = tif;
      std::__cxx11::string::_M_replace
                ((ulong)&pTVar1->inputFilePath,0,(char *)(pTVar1->inputFilePath)._M_string_length,
                 0x339aaa);
      this->mT2p->pdf_page = inTIFFUsageParameters->PageIndex;
      uVar4 = inTIFFUsageParameters->PageIndex;
      bVar5 = (inTIFFUsageParameters->BWTreatment).AsImageMask;
      bVar6 = (inTIFFUsageParameters->BWTreatment).OneColor.UseCMYK;
      uVar7 = (inTIFFUsageParameters->BWTreatment).OneColor.RGBComponents[0];
      uVar8 = (inTIFFUsageParameters->BWTreatment).OneColor.RGBComponents[1];
      uVar2 = *(undefined8 *)((inTIFFUsageParameters->BWTreatment).OneColor.RGBComponents + 2);
      CVar3 = (inTIFFUsageParameters->GrayscaleTreatment).ZeroColor;
      (this->mUserParameters).GrayscaleTreatment.OneColor =
           (inTIFFUsageParameters->GrayscaleTreatment).OneColor;
      (this->mUserParameters).GrayscaleTreatment.ZeroColor = CVar3;
      (this->mUserParameters).PageIndex = uVar4;
      (this->mUserParameters).BWTreatment.AsImageMask = bVar5;
      (this->mUserParameters).BWTreatment.OneColor.UseCMYK = bVar6;
      (this->mUserParameters).BWTreatment.OneColor.RGBComponents[0] = uVar7;
      (this->mUserParameters).BWTreatment.OneColor.RGBComponents[1] = uVar8;
      *(undefined8 *)((this->mUserParameters).BWTreatment.OneColor.RGBComponents + 2) = uVar2;
      pPVar10 = ConvertTiff2PDF(this,inFormXObjectID);
    }
  }
  DestroyConversionState(this);
  if (tif != (TIFF *)0x0) {
    TIFFClose(tif);
  }
  return pPVar10;
}

Assistant:

PDFFormXObject* TIFFImageHandler::CreateFormXObjectFromTIFFStream(	IByteReaderWithPosition* inTIFFStream,
																	ObjectIDType inFormXObjectID,
																	const TIFFUsageParameters& inTIFFUsageParameters)
{

	PDFFormXObject* imageFormXObject = NULL;
	TIFF* input = NULL;

	do
	{
		TIFFSetErrorHandler(ReportError);
		TIFFSetWarningHandler(ReportWarning);

		if(!mObjectsContext || !mContainerDocumentContext)
		{
			TRACE_LOG("TIFFImageHandler::CreateFormXObjectFromTIFFFile. Unexpected Error, mObjectsContext or mContainerDocumentContext not initialized");
			break;
		}

		StreamWithPos streamInfo;
		streamInfo.mStream = inTIFFStream;
		streamInfo.mOriginalPosition = inTIFFStream->GetCurrentPosition();
		
		input = TIFFClientOpen("Stream","r",(thandle_t)&streamInfo,STATIC_streamRead,
																	STATIC_streamWrite,
																	STATIC_streamSeek,
																	STATIC_streamClose,
																	STATIC_tiffSize,
																	STATIC_tiffMap,
																	STATIC_tiffUnmap);
		if(!input)
		{
			TRACE_LOG("TIFFImageHandler::CreateFormXObjectFromTIFFFile. cannot open stream for reading");
			break;
		}


		InitializeConversionState();
		mT2p->input = input;
		mT2p->inputFilePath = "";
		mT2p->pdf_page = inTIFFUsageParameters.PageIndex;
		mUserParameters = inTIFFUsageParameters;

		imageFormXObject = ConvertTiff2PDF(inFormXObjectID);

	}while(false);

	DestroyConversionState();
	if(input != NULL)
		TIFFClose(input);

	return imageFormXObject;
}